

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_pow(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  char *src;
  err_frame_t *peVar4;
  CVmException *pCVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext2;
  char *val2_ext;
  uint hdl2;
  uint hdl1;
  char *new_ext;
  err_frame_t err_cur__;
  vm_val_t val2;
  
  iVar6 = setup_getp_1(this,self,retval,argc,&new_ext,&val2,&val2_ext,0);
  if (iVar6 != 0) {
    return 1;
  }
  uVar2 = *(ushort *)new_ext;
  if (((this->super_CVmObject).ext_[4] & 8U) != 0) {
    if ((val2_ext[4] & 8U) != 0) {
LAB_00230020:
      err_throw(0x7eb);
    }
    if ((val2_ext[4] & 1U) != 0) {
      err_throw(0x7d8);
    }
    new_ext[2] = '\x01';
    new_ext[3] = '\0';
    new_ext[4] = new_ext[4] & 0xf0U | 8;
    memset(new_ext + 5,0,(ulong)(uVar2 + 1 >> 1));
    goto LAB_0022ff8d;
  }
  alloc_temp_regs((ulong)uVar2 + 3,2,&ext1,&hdl1,&ext2,&hdl2);
  G_err_frame::__tls_init();
  err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    src = (this->super_CVmObject).ext_;
    if ((src[4] & 1U) == 0) {
      compute_ln_into(ext1,src);
LAB_0022fea1:
      compute_prod_into(ext2,val2_ext,ext1);
      compute_exp_into(ext1,ext2);
    }
    else {
      copy_val(ext2,src,0);
      ext2[4] = ext2[4] & 0xfe;
      sVar3 = *(short *)(val2_ext + 2);
      uVar7 = (long)sVar3 & 0xffffffff;
      uVar8 = 0;
      if (-1 < (long)sVar3) {
        uVar8 = uVar7;
      }
      uVar2 = *(ushort *)val2_ext;
      if (uVar8 < uVar2) {
        iVar6 = (int)uVar8 * 4;
        do {
          if (((byte)val2_ext[(uVar8 >> 1) + 5] >> (~(byte)iVar6 & 4) & 0xf) != 0)
          goto LAB_00230020;
          uVar8 = uVar8 + 1;
          iVar6 = iVar6 + 4;
        } while (uVar2 != uVar8);
      }
      if ((uint)uVar2 < (uint)(int)sVar3 || sVar3 < 1) {
        compute_ln_into(ext1,ext2);
        goto LAB_0022fea1;
      }
      uVar7 = uVar7 - 1;
      bVar1 = val2_ext[(uVar7 >> 1) + 5];
      compute_ln_into(ext1,ext2);
      compute_prod_into(ext2,val2_ext,ext1);
      compute_exp_into(ext1,ext2);
      if (((bVar1 >> (~(byte)((int)uVar7 << 2) & 4) & 1) != 0) && ((ext1[4] & 8U) == 0)) {
        ext1[4] = ext1[4] ^ 1;
      }
    }
    copy_val(new_ext,ext1,1);
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    release_temp_regs(2,(ulong)hdl1,(ulong)hdl2);
  }
  peVar4 = err_cur__.prv_;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)peVar4;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pCVar5 = err_cur__.exc_;
    G_err_frame::__tls_init();
    *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar5;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
LAB_0022ff8d:
  sp_ = sp_ + -2;
  return 1;
}

Assistant:

int CVmObjBigNum::getp_pow(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *val2_ext;
    char *new_ext;
    size_t prec;
    uint hdl1, hdl2;
    char *ext1, *ext2;

    /* check arguments and allocate the result value */
    if (setup_getp_1(vmg_ self, retval, argc, &new_ext,
                     &val2, &val2_ext, FALSE))
        return TRUE;

    /* use the precision of the result */
    prec = get_prec(new_ext);
    
    /* 
     *   Check for a special case: if the number we're exponentiating is
     *   zero, the result is 0 for any positive exponent, and an error for
     *   any non-positive exponent (0^0 is undefined, and 0^n where n<0 is
     *   equivalent to 1/0^n == 1/0, which is a divide-by-zero error).  
     */
    if (is_zero(ext_))
    {
        /* 0^0 is undefined */
        if (is_zero(val2_ext))
            err_throw(VMERR_OUT_OF_RANGE);

        /* 0^negative is a divide by zero error */
        if (get_neg(val2_ext))
            err_throw(VMERR_DIVIDE_BY_ZERO);
        
        /* set the result to one, and we're done */
        set_zero(new_ext);
        goto done;
    }

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 2,
                    &ext1, &hdl1, &ext2, &hdl2);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        int result_neg;
        
        /*
         *   If a = e^b, then b = ln(a).  This means that x^y = e^ln(x^y)
         *   = e^(y * ln(x)).  So, we can compute the result in terms of
         *   natural logarithm and exponentiation of 'e', for which we
         *   have primitives we can call.  
         */

        /*
         *   If x is negative, we can only exponentiate the value to
         *   integer powers.  In this case, we can substitute x' = -x
         *   (hence x' will be positive), and rewrite the expression as
         *   
         *   (-1)^y * (x')^y
         *   
         *   We can only calculate (-1)^y for integer values of y, since
         *   the result is complex if y is not an integer.  
         */
        if (get_neg(ext_))
        {
            size_t idx;
            int units_dig;
            
            /* copy x into r2 */
            copy_val(ext2, ext_, FALSE);

            /* 
             *   calculate x' = (-x) - since x is negative, this will
             *   guarantee that x' is positive 
             */
            set_neg(ext2, FALSE);

            /* 
             *   make sure y is an integer - start at the first digit
             *   after the decimal point and check for any non-zero digits 
             */
            idx = (get_exp(val2_ext) < 0 ? 0 : (size_t)get_exp(val2_ext));
            for ( ; idx < get_prec(val2_ext) ; ++idx)
            {
                /* if this digit isn't a zero, it's not an integer */
                if (get_dig(val2_ext, idx) != 0)
                {
                    /* y isn't an integer, so we can't calculate (-1)^y */
                    err_throw(VMERR_OUT_OF_RANGE);
                }
            }

            /* get the first digit to the left of the decimal point */
            if (get_exp(val2_ext) <= 0
                || (size_t)get_exp(val2_ext) > get_prec(val2_ext))
            {
                /* the units digit isn't represented - zero is implied */
                units_dig = 0;
            }
            else
            {
                /* get the digit */
                units_dig = get_dig(val2_ext, (size_t)get_exp(val2_ext) - 1);
            }

            /* 
             *   if the units digit is even, the result will be positive;
             *   if it's odd, the result will be negative 
             */
            result_neg = ((units_dig & 1) != 0);

            /* calculate ln(x') into r1 */
            compute_ln_into(ext1, ext2);
        }
        else
        {
            /* calculate ln(x) into r1 */
            compute_ln_into(ext1, ext_);

            /* the result will be positive */
            result_neg = FALSE;
        }

        /* calculate y * ln(x) into r2 */
        compute_prod_into(ext2, val2_ext, ext1);

        /* calculate exp(r2) = exp(y*ln(x)) = x^y into r1 */
        compute_exp_into(ext1, ext2);

        /* negate the result if we had a negative x and an odd power */
        if (result_neg)
            negate(ext1);

        /* save the result, rounding as needed */
        copy_val(new_ext, ext1, TRUE);
    }